

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StopFreezeReliablePdu.cpp
# Opt level: O2

bool __thiscall
DIS::StopFreezeReliablePdu::operator==(StopFreezeReliablePdu *this,StopFreezeReliablePdu *rhs)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined1 auVar11 [14];
  undefined1 auVar12 [12];
  unkbyte10 Var13;
  bool bVar14;
  bool bVar15;
  undefined4 extraout_EDX;
  int iVar16;
  undefined1 auVar17 [11];
  undefined1 auVar20 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar29 [16];
  undefined1 auVar18 [12];
  undefined1 auVar23 [16];
  undefined1 auVar19 [13];
  undefined1 auVar24 [16];
  undefined1 auVar30 [16];
  undefined1 auVar26 [16];
  undefined1 auVar25 [16];
  char cVar31;
  char cVar32;
  char cVar33;
  undefined2 uVar34;
  byte bVar35;
  
  bVar14 = SimulationManagementWithReliabilityFamilyPdu::operator==
                     (&this->super_SimulationManagementWithReliabilityFamilyPdu,
                      &rhs->super_SimulationManagementWithReliabilityFamilyPdu);
  bVar15 = ClockTime::operator==(&this->_realWorldTime,&rhs->_realWorldTime);
  uVar1 = this->_reason;
  uVar3 = this->_frozenBehavior;
  uVar5 = this->_requiredReliablityService;
  uVar7 = this->_pad1;
  uVar9 = this->_requestID;
  uVar2 = rhs->_reason;
  uVar4 = rhs->_frozenBehavior;
  uVar6 = rhs->_requiredReliablityService;
  uVar8 = rhs->_pad1;
  uVar10 = rhs->_requestID;
  cVar31 = -((char)uVar10 == (char)uVar9);
  cVar32 = -((char)((uint)uVar10 >> 8) == (char)((uint)uVar9 >> 8));
  cVar33 = -((char)((uint)uVar10 >> 0x10) == (char)((uint)uVar9 >> 0x10));
  bVar35 = -((char)((uint)uVar10 >> 0x18) == (char)((uint)uVar9 >> 0x18));
  auVar21._0_9_ = CONCAT18(0xff,(ulong)bVar35 << 0x38);
  auVar17._0_10_ = CONCAT19(0xff,auVar21._0_9_);
  auVar17[10] = 0xff;
  auVar18[0xb] = 0xff;
  auVar18._0_11_ = auVar17;
  auVar19[0xc] = 0xff;
  auVar19._0_12_ = auVar18;
  auVar26[0xd] = 0xff;
  auVar26._0_13_ = auVar19;
  auVar26[0xe] = bVar35;
  auVar26[0xf] = bVar35;
  auVar25._14_2_ = auVar26._14_2_;
  auVar25[0xd] = cVar33;
  auVar25._0_13_ = auVar19;
  auVar24._13_3_ = auVar25._13_3_;
  auVar24[0xc] = cVar33;
  auVar24._0_12_ = auVar18;
  auVar23._12_4_ = auVar24._12_4_;
  auVar23[0xb] = cVar32;
  auVar23._0_11_ = auVar17;
  auVar22._11_5_ = auVar23._11_5_;
  auVar22[10] = cVar32;
  auVar22._0_10_ = auVar17._0_10_;
  auVar21._10_6_ = auVar22._10_6_;
  auVar21[9] = cVar31;
  Var13 = CONCAT91(CONCAT81((long)(CONCAT72(auVar21._9_7_,CONCAT11(cVar31,bVar35)) >> 8),
                            -(uVar8 == uVar7)),-(uVar8 == uVar7));
  auVar12._2_10_ = Var13;
  auVar12[1] = -(uVar6 == uVar5);
  auVar12[0] = -(uVar6 == uVar5);
  auVar11._2_12_ = auVar12;
  auVar11[1] = -(uVar4 == uVar3);
  auVar11[0] = -(uVar4 == uVar3);
  auVar20._0_2_ = CONCAT11(-(uVar2 == uVar1),-(uVar2 == uVar1));
  auVar20._2_14_ = auVar11;
  uVar34 = (undefined2)Var13;
  auVar30._0_12_ = auVar20._0_12_;
  auVar30._12_2_ = uVar34;
  auVar30._14_2_ = uVar34;
  auVar29._12_4_ = auVar30._12_4_;
  auVar29._0_10_ = auVar20._0_10_;
  auVar29._10_2_ = auVar12._0_2_;
  auVar28._10_6_ = auVar29._10_6_;
  auVar28._0_8_ = auVar20._0_8_;
  auVar28._8_2_ = auVar12._0_2_;
  auVar27._8_8_ = auVar28._8_8_;
  auVar27._6_2_ = auVar11._0_2_;
  auVar27._4_2_ = auVar11._0_2_;
  auVar27._2_2_ = auVar20._0_2_;
  auVar27._0_2_ = auVar20._0_2_;
  iVar16 = movmskps(extraout_EDX,auVar27);
  return (bVar15 && bVar14) && (iVar16 == 0xf && rhs->_requestID == this->_requestID);
}

Assistant:

bool StopFreezeReliablePdu::operator ==(const StopFreezeReliablePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SimulationManagementWithReliabilityFamilyPdu::operator==(rhs);

     if( ! (_realWorldTime == rhs._realWorldTime) ) ivarsEqual = false;
     if( ! (_reason == rhs._reason) ) ivarsEqual = false;
     if( ! (_frozenBehavior == rhs._frozenBehavior) ) ivarsEqual = false;
     if( ! (_requiredReliablityService == rhs._requiredReliablityService) ) ivarsEqual = false;
     if( ! (_pad1 == rhs._pad1) ) ivarsEqual = false;
     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;

    return ivarsEqual;
 }